

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerMSL::replace_illegal_names(CompilerMSL *this)

{
  ParsedIR *this_00;
  ID IVar1;
  size_t sVar2;
  Meta *pMVar3;
  const_iterator cVar4;
  TypedID<(spirv_cross::Types)0> *id;
  TypedID<(spirv_cross::Types)0> *pTVar5;
  Decoration *mbr_dec;
  Decoration *__k;
  long lVar6;
  LoopLock loop_lock;
  LoopLock LStack_48;
  CompilerMSL *local_40;
  TypedID<(spirv_cross::Types)0> *local_38;
  
  get_reserved_keyword_set_abi_cxx11_();
  get_illegal_func_names_abi_cxx11_();
  this_00 = &(this->super_CompilerGLSL).super_Compiler.ir;
  ParsedIR::create_loop_hard_lock(this_00);
  pTVar5 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  sVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  local_40 = this;
  for (lVar6 = 0; sVar2 << 2 != lVar6; lVar6 = lVar6 + 4) {
    IVar1.id = *(uint32_t *)((long)&pTVar5->id + lVar6);
    if ((local_40->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.
        ptr[IVar1.id].type == TypeVariable) {
      ParsedIR::get<spirv_cross::SPIRVariable>(this_00,IVar1.id);
      pMVar3 = ParsedIR::find_meta(this_00,IVar1);
      if (pMVar3 != (Meta *)0x0) {
        cVar4 = ::std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find(&get_reserved_keyword_set[abi:cxx11]()::keywords_abi_cxx11_._M_h,
                       (key_type *)pMVar3);
        if (cVar4.
            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ._M_cur != (__node_type *)0x0) {
          ::std::__cxx11::string::append((char *)pMVar3);
        }
      }
    }
  }
  ParsedIR::LoopLock::~LoopLock(&LStack_48);
  ParsedIR::create_loop_hard_lock(this_00);
  pTVar5 = (local_40->super_CompilerGLSL).super_Compiler.ir.ids_for_type[4].
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  sVar2 = (local_40->super_CompilerGLSL).super_Compiler.ir.ids_for_type[4].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  for (lVar6 = 0; sVar2 << 2 != lVar6; lVar6 = lVar6 + 4) {
    IVar1.id = *(uint32_t *)((long)&pTVar5->id + lVar6);
    if ((local_40->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.
        ptr[IVar1.id].type == TypeFunction) {
      ParsedIR::get<spirv_cross::SPIRFunction>(this_00,IVar1.id);
      pMVar3 = ParsedIR::find_meta(this_00,IVar1);
      if (pMVar3 != (Meta *)0x0) {
        cVar4 = ::std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find(&get_illegal_func_names[abi:cxx11]()::illegal_func_names_abi_cxx11_._M_h,
                       (key_type *)pMVar3);
        if (cVar4.
            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ._M_cur != (__node_type *)0x0) {
          ::std::__cxx11::string::append((char *)pMVar3);
        }
      }
    }
  }
  ParsedIR::LoopLock::~LoopLock(&LStack_48);
  ParsedIR::create_loop_hard_lock(this_00);
  pTVar5 = (local_40->super_CompilerGLSL).super_Compiler.ir.ids_for_type[1].
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  local_38 = pTVar5 + (local_40->super_CompilerGLSL).super_Compiler.ir.ids_for_type[1].
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  for (; pTVar5 != local_38; pTVar5 = pTVar5 + 1) {
    IVar1.id = pTVar5->id;
    if ((local_40->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.
        ptr[IVar1.id].type == TypeType) {
      ParsedIR::get<spirv_cross::SPIRType>(this_00,IVar1.id);
      pMVar3 = ParsedIR::find_meta(this_00,IVar1);
      if (pMVar3 != (Meta *)0x0) {
        __k = (pMVar3->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr;
        for (lVar6 = (pMVar3->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size *
                     0x188; lVar6 != 0; lVar6 = lVar6 + -0x188) {
          cVar4 = ::std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::find(&get_reserved_keyword_set[abi:cxx11]()::keywords_abi_cxx11_._M_h,
                         &__k->alias);
          if (cVar4.
              super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ._M_cur != (__node_type *)0x0) {
            ::std::__cxx11::string::append((char *)__k);
          }
          __k = __k + 1;
        }
      }
    }
  }
  ParsedIR::LoopLock::~LoopLock(&LStack_48);
  CompilerGLSL::replace_illegal_names(&local_40->super_CompilerGLSL);
  return;
}

Assistant:

void CompilerMSL::replace_illegal_names()
{
	// FIXME: MSL and GLSL are doing two different things here.
	// Agree on convention and remove this override.
	auto &keywords = get_reserved_keyword_set();
	auto &illegal_func_names = get_illegal_func_names();

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t self, SPIRVariable &) {
		auto *meta = ir.find_meta(self);
		if (!meta)
			return;

		auto &dec = meta->decoration;
		if (keywords.find(dec.alias) != end(keywords))
			dec.alias += "0";
	});

	ir.for_each_typed_id<SPIRFunction>([&](uint32_t self, SPIRFunction &) {
		auto *meta = ir.find_meta(self);
		if (!meta)
			return;

		auto &dec = meta->decoration;
		if (illegal_func_names.find(dec.alias) != end(illegal_func_names))
			dec.alias += "0";
	});

	ir.for_each_typed_id<SPIRType>([&](uint32_t self, SPIRType &) {
		auto *meta = ir.find_meta(self);
		if (!meta)
			return;

		for (auto &mbr_dec : meta->members)
			if (keywords.find(mbr_dec.alias) != end(keywords))
				mbr_dec.alias += "0";
	});

	CompilerGLSL::replace_illegal_names();
}